

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.cpp
# Opt level: O1

Sexp * __thiscall GcHeap::GcHeapImpl::Copy(GcHeapImpl *this,Sexp *from_ref)

{
  pointer *pppSVar1;
  iterator __position;
  Sexp *pSVar2;
  uint64_t uVar3;
  Kind KVar4;
  undefined4 uVar5;
  Sexp *pSVar6;
  mapped_type *ppSVar7;
  Sexp *local_28;
  Sexp *from_ref_local;
  Sexp *to_ref;
  
  from_ref_local = (Sexp *)this->free;
  this->free = (uint8_t *)(from_ref_local + 1);
  local_28 = from_ref;
  DebugLog("[%d] relocating: %p -> %p",this->gc_number,from_ref);
  pSVar6 = from_ref_local;
  if (local_28->padding != 0xabababababababab) {
    KVar4 = local_28->kind;
    uVar5 = *(undefined4 *)&local_28->field_0x4;
    pSVar2 = (local_28->field_1).cons.car;
    uVar3 = local_28->padding;
    (from_ref_local->field_1).cons.cdr = (local_28->field_1).cons.cdr;
    from_ref_local->padding = uVar3;
    from_ref_local->kind = KVar4;
    *(undefined4 *)&from_ref_local->field_0x4 = uVar5;
    (from_ref_local->field_1).cons.car = pSVar2;
    *(undefined8 *)local_28 = 0xabababababababab;
    (local_28->field_1).cons.car = (Sexp *)0xabababababababab;
    (local_28->field_1).cons.cdr = (Sexp *)0xabababababababab;
    local_28->padding = 0xabababababababab;
    ppSVar7 = std::__detail::
              _Map_base<Sexp_*,_std::pair<Sexp_*const,_Sexp_*>,_std::allocator<std::pair<Sexp_*const,_Sexp_*>_>,_std::__detail::_Select1st,_std::equal_to<Sexp_*>,_std::hash<Sexp_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<Sexp_*,_std::pair<Sexp_*const,_Sexp_*>,_std::allocator<std::pair<Sexp_*const,_Sexp_*>_>,_std::__detail::_Select1st,_std::equal_to<Sexp_*>,_std::hash<Sexp_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->forwarding_addresses,&local_28);
    *ppSVar7 = pSVar6;
    __position._M_current =
         (this->worklist).super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->worklist).super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Sexp*,std::allocator<Sexp*>>::_M_realloc_insert<Sexp*const&>
                ((vector<Sexp*,std::allocator<Sexp*>> *)&this->worklist,__position,&from_ref_local);
    }
    else {
      *__position._M_current = from_ref_local;
      pppSVar1 = &(this->worklist).super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppSVar1 = *pppSVar1 + 1;
    }
    return from_ref_local;
  }
  __assert_fail("from_ref->padding != 0xabababababababab && \"relocating an invalid object\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/gc.cpp"
                ,0x156,"Sexp *GcHeap::GcHeapImpl::Copy(Sexp *)");
}

Assistant:

Sexp *Copy(Sexp *from_ref) {
    Sexp *to_ref = (Sexp *)free;
    free += sizeof(Sexp);
    // this copy is guaranteed not to overlap since it
    // doesn't cross the fromspace/tospace boundary.
    DebugLog("[%d] relocating: %p -> %p", gc_number, from_ref, to_ref);
#ifdef DEBUG
    assert(from_ref->padding != 0xabababababababab &&
           "relocating an invalid object");
#endif
    memcpy(to_ref, from_ref, sizeof(Sexp));

#ifdef DEBUG
    // use a distinct bit pattern to ensure that
    // we insta-crash on a GC hole.
    memset(from_ref, 0xAB, sizeof(Sexp));
#endif

    forwarding_addresses[from_ref] = to_ref;
    worklist.push_back(to_ref);
    return to_ref;
  }